

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<OmegaOP> * __thiscall
pybind11::class_<OmegaOP>::def<std::vector<double,std::allocator<double>>(OmegaOP::*)()const>
          (class_<OmegaOP> *this,char *name_,offset_in_OmegaOP_to_subr *f)

{
  offset_in_OmegaOP_to_subr f_00;
  name *extra;
  cpp_function cf;
  handle local_60;
  cpp_function local_58;
  handle local_50;
  object local_48;
  obj_attr_accessor local_40;
  PyObject *local_20;
  
  f_00 = *f;
  extra = (name *)f[1];
  local_60.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_40._0_8_ = name_;
  getattr((pybind11 *)&local_50,local_60,name_,(PyObject *)&_Py_NoneStruct);
  local_20 = local_50.m_ptr;
  cpp_function::
  cpp_function<std::vector<double,std::allocator<double>>,OmegaOP,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_58,f_00,extra,(is_method *)&local_40,(sibling *)&local_60);
  object::~object((object *)&local_50);
  object::~object(&local_48);
  cpp_function::name((cpp_function *)&local_60);
  detail::object_api<pybind11::handle>::attr
            (&local_40,(object_api<pybind11::handle> *)this,local_60);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_40,&local_58);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_40);
  object::~object((object *)&local_60);
  object::~object((object *)&local_58);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }